

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t pmevcntr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint8_t counter)

{
  if ((uint)ri < ((uint)(env->cp15).c9_pmcr >> 0xb & 0x1f)) {
    pmevcntr_op_start(env,(uint8_t)ri);
    return (env->cp15).c14_pmevcntr[(ulong)ri & 0xff];
  }
  return 0;
}

Assistant:

static uint64_t pmevcntr_read(CPUARMState *env, const ARMCPRegInfo *ri,
                              uint8_t counter)
{
    if (counter < pmu_num_counters(env)) {
        uint64_t ret;
        pmevcntr_op_start(env, counter);
        ret = env->cp15.c14_pmevcntr[counter];
        pmevcntr_op_finish(env, counter);
        return ret;
    } else {
      /* We opt to behave as a RAZ/WI when attempts to access PM[X]EVCNTR
       * are CONSTRAINED UNPREDICTABLE. */
        return 0;
    }
}